

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O0

bool glu::
     isValidTypePath<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
               (VarType *type,
               __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               begin,__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                     end)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  StructType *pSVar4;
  StructMember *this;
  pointer pVVar5;
  DataType local_3c;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  _Stack_38;
  DataType basicType;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  pathIter;
  VarType *curType;
  VarType *type_local;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  end_local;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  begin_local;
  
  _Stack_38._M_current = begin._M_current;
  pathIter._M_current = (VarTypeComponent *)type;
  type_local = (VarType *)end._M_current;
  end_local._M_current = begin._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           (&stack0xffffffffffffffc8,
                            (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                             *)&type_local), bVar1) {
    pVVar5 = __gnu_cxx::
             __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
             ::operator->(&stack0xffffffffffffffc8);
    if (pVVar5->type == STRUCT_MEMBER) {
      bVar1 = VarType::isStructType((VarType *)pathIter._M_current);
      if (!bVar1) {
        return false;
      }
      pVVar5 = __gnu_cxx::
               __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               ::operator->(&stack0xffffffffffffffc8);
      iVar3 = pVVar5->index;
      pSVar4 = VarType::getStructPtr((VarType *)pathIter._M_current);
      iVar2 = StructType::getNumMembers(pSVar4);
      bVar1 = de::inBounds<int>(iVar3,0,iVar2);
      if (!bVar1) {
        return false;
      }
      pSVar4 = VarType::getStructPtr((VarType *)pathIter._M_current);
      pVVar5 = __gnu_cxx::
               __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               ::operator->(&stack0xffffffffffffffc8);
      this = StructType::getMember(pSVar4,pVVar5->index);
      pathIter._M_current = (VarTypeComponent *)StructMember::getType(this);
    }
    else {
      pVVar5 = __gnu_cxx::
               __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               ::operator->(&stack0xffffffffffffffc8);
      if (pVVar5->type != ARRAY_ELEMENT) break;
      bVar1 = VarType::isArrayType((VarType *)pathIter._M_current);
      if (!bVar1) {
        return false;
      }
      iVar3 = VarType::getArraySize((VarType *)pathIter._M_current);
      if (iVar3 != -1) {
        pVVar5 = __gnu_cxx::
                 __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                 ::operator->(&stack0xffffffffffffffc8);
        iVar3 = pVVar5->index;
        iVar2 = VarType::getArraySize((VarType *)pathIter._M_current);
        bVar1 = de::inBounds<int>(iVar3,0,iVar2);
        if (!bVar1) {
          return false;
        }
      }
      pathIter._M_current = (VarTypeComponent *)VarType::getElementType(pathIter._M_current);
    }
    __gnu_cxx::
    __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
    ::operator++(&stack0xffffffffffffffc8);
  }
  bVar1 = __gnu_cxx::operator!=
                    (&stack0xffffffffffffffc8,
                     (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      *)&type_local);
  if (bVar1) {
    bVar1 = VarType::isBasicType((VarType *)pathIter._M_current);
    if (!bVar1) {
      return false;
    }
    local_3c = VarType::getBasicType((VarType *)pathIter._M_current);
    pVVar5 = __gnu_cxx::
             __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
             ::operator->(&stack0xffffffffffffffc8);
    if (pVVar5->type == MATRIX_COLUMN) {
      bVar1 = isDataTypeMatrix(local_3c);
      if (!bVar1) {
        return false;
      }
      iVar3 = getDataTypeMatrixNumRows(local_3c);
      local_3c = getDataTypeFloatVec(iVar3);
      __gnu_cxx::
      __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
      ::operator++(&stack0xffffffffffffffc8);
    }
    bVar1 = __gnu_cxx::operator!=
                      (&stack0xffffffffffffffc8,
                       (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                        *)&type_local);
    if ((bVar1) &&
       (pVVar5 = __gnu_cxx::
                 __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                 ::operator->(&stack0xffffffffffffffc8), pVVar5->type == VECTOR_COMPONENT)) {
      bVar1 = isDataTypeVector(local_3c);
      if (!bVar1) {
        return false;
      }
      getDataTypeScalarType(local_3c);
      __gnu_cxx::
      __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
      ::operator++(&stack0xffffffffffffffc8);
    }
  }
  bVar1 = __gnu_cxx::operator==
                    (&stack0xffffffffffffffc8,
                     (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      *)&type_local);
  return bVar1;
}

Assistant:

bool isValidTypePath (const VarType& type, Iterator begin, Iterator end)
{
	const VarType*	curType		= &type;
	Iterator		pathIter	= begin;

	// Process struct member and array element parts of path.
	while (pathIter != end)
	{
		if (pathIter->type == VarTypeComponent::STRUCT_MEMBER)
		{
			if (!curType->isStructType() || !de::inBounds(pathIter->index, 0, curType->getStructPtr()->getNumMembers()))
				return false;

			curType = &curType->getStructPtr()->getMember(pathIter->index).getType();
		}
		else if (pathIter->type == VarTypeComponent::ARRAY_ELEMENT)
		{
			if (!curType->isArrayType() || (curType->getArraySize() != VarType::UNSIZED_ARRAY && !de::inBounds(pathIter->index, 0, curType->getArraySize())))
				return false;

			curType = &curType->getElementType();
		}
		else
			break;

		++pathIter;
	}

	if (pathIter != end)
	{
		DE_ASSERT(pathIter->type == VarTypeComponent::MATRIX_COLUMN || pathIter->type == VarTypeComponent::VECTOR_COMPONENT);

		// Current type should be basic type.
		if (!curType->isBasicType())
			return false;

		DataType basicType = curType->getBasicType();

		if (pathIter->type == VarTypeComponent::MATRIX_COLUMN)
		{
			if (!isDataTypeMatrix(basicType))
				return false;

			basicType = getDataTypeFloatVec(getDataTypeMatrixNumRows(basicType));
			++pathIter;
		}

		if (pathIter != end && pathIter->type == VarTypeComponent::VECTOR_COMPONENT)
		{
			if (!isDataTypeVector(basicType))
				return false;

			basicType = getDataTypeScalarType(basicType);
			++pathIter;
		}
	}

	return pathIter == end;
}